

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

void __thiscall
icu_63::CollationIterator::appendNumericSegmentCEs
          (CollationIterator *this,char *digits,int32_t length,UErrorCode *errorCode)

{
  char *pcVar1;
  CEBuffer *this_00;
  uint uVar2;
  long lVar3;
  UBool UVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  
  uVar2 = this->data->numericPrimary;
  if (length < 8) {
    uVar11 = (uint)*digits;
    if (1 < length) {
      uVar10 = 1;
      do {
        uVar11 = (int)digits[uVar10] + uVar11 * 10;
        uVar10 = uVar10 + 1;
      } while ((uint)length != uVar10);
    }
    if ((int)uVar11 < 0x4a) {
      uVar10 = (ulong)(uVar11 * 0x10000 + 0x20000 | uVar2);
      goto LAB_0022ab16;
    }
    if (uVar11 < 0x27fa) {
      uVar5 = (uVar11 - 0x4a & 0xffff) / 0xfe;
      uVar10 = (ulong)(uVar5 * 0x10000 + 0x4c0000 | uVar2 |
                      (((uVar11 - 0x4a) + uVar5 * 2) * 0x100 & 0xffff) + 0x200);
      goto LAB_0022ab16;
    }
    if (uVar11 < 0xfe83a) {
      uVar5 = uVar11 - 0x27fa >> 1;
      uVar10 = (ulong)(((uint)((ulong)(uVar11 - 0x27fa >> 2) * 0x41030815 >> 0x20) & 0xffff000) *
                       0x10 + (uVar5 / 0x7f) * 2 + (uVar5 / 0x7f) * -0x100 + uVar11 + 0x73d808 |
                       uVar2 | (((((uVar5 / 0x7f & 0xffff) >> 1) * 0x8103 >> 0x15 & 0xfe) +
                                uVar5 / 0x7f) * 0x100 & 0xffff) + 0x200);
      goto LAB_0022ab16;
    }
  }
  uVar11 = ((length - (length + 1 >> 0x1f)) + 1U & 0xfffffffe) * 0x8000 + 0x800000 | uVar2;
  pcVar7 = digits + (long)length + -1;
  do {
    uVar5 = length;
    if (*pcVar7 != '\0') break;
    pcVar1 = pcVar7 + -1;
    pcVar7 = pcVar7 + -2;
    length = uVar5 - 2;
  } while (*pcVar1 == '\0');
  iVar12 = (int)*digits;
  uVar6 = 1;
  if ((uVar5 & 1) == 0) {
    iVar12 = (int)digits[1] + iVar12 * 10;
    uVar6 = 2;
  }
  iVar12 = iVar12 * 2;
  iVar9 = 8;
  if ((int)uVar6 < (int)uVar5) {
    this_00 = &this->ceBuffer;
    uVar10 = (ulong)uVar6;
    do {
      if (iVar9 == 0) {
        iVar9 = this_00->length;
        if (0x27 < iVar9) {
          UVar4 = CEBuffer::ensureAppendCapacity(this_00,1,errorCode);
          if (UVar4 == '\0') {
            iVar9 = 0x10;
            uVar11 = uVar2;
            goto LAB_0022aad5;
          }
          iVar9 = this_00->length;
        }
        (this->ceBuffer).length = iVar9 + 1;
        (this->ceBuffer).buffer.ptr[iVar9] = (ulong)(iVar12 + 0xbU | uVar11) << 0x20 | 0x5000500;
        iVar9 = 0x10;
        uVar11 = uVar2;
      }
      else {
        bVar8 = (byte)iVar9;
        iVar9 = iVar9 + -8;
        uVar11 = iVar12 + 0xbU << (bVar8 & 0x1f) | uVar11;
      }
LAB_0022aad5:
      pcVar7 = digits + uVar10;
      lVar3 = uVar10 + 1;
      uVar10 = uVar10 + 2;
      iVar12 = ((int)digits[lVar3] + *pcVar7 * 10) * 2;
    } while ((int)uVar10 < (int)uVar5);
  }
  uVar10 = (ulong)(iVar12 + 10 << ((byte)iVar9 & 0x1f) | uVar11);
LAB_0022ab16:
  iVar12 = (this->ceBuffer).length;
  if (0x27 < iVar12) {
    UVar4 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,1,errorCode);
    if (UVar4 == '\0') {
      return;
    }
    iVar12 = (this->ceBuffer).length;
  }
  (this->ceBuffer).length = iVar12 + 1;
  (this->ceBuffer).buffer.ptr[iVar12] = uVar10 << 0x20 | 0x5000500;
  return;
}

Assistant:

void
CollationIterator::appendNumericSegmentCEs(const char *digits, int32_t length, UErrorCode &errorCode) {
    U_ASSERT(1 <= length && length <= 254);
    U_ASSERT(length == 1 || digits[0] != 0);
    uint32_t numericPrimary = data->numericPrimary;
    // Note: We use primary byte values 2..255: digits are not compressible.
    if(length <= 7) {
        // Very dense encoding for small numbers.
        int32_t value = digits[0];
        for(int32_t i = 1; i < length; ++i) {
            value = value * 10 + digits[i];
        }
        // Primary weight second byte values:
        //     74 byte values   2.. 75 for small numbers in two-byte primary weights.
        //     40 byte values  76..115 for medium numbers in three-byte primary weights.
        //     16 byte values 116..131 for large numbers in four-byte primary weights.
        //    124 byte values 132..255 for very large numbers with 4..127 digit pairs.
        int32_t firstByte = 2;
        int32_t numBytes = 74;
        if(value < numBytes) {
            // Two-byte primary for 0..73, good for day & month numbers etc.
            uint32_t primary = numericPrimary | ((firstByte + value) << 16);
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        value -= numBytes;
        firstByte += numBytes;
        numBytes = 40;
        if(value < numBytes * 254) {
            // Three-byte primary for 74..10233=74+40*254-1, good for year numbers and more.
            uint32_t primary = numericPrimary |
                ((firstByte + value / 254) << 16) | ((2 + value % 254) << 8);
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        value -= numBytes * 254;
        firstByte += numBytes;
        numBytes = 16;
        if(value < numBytes * 254 * 254) {
            // Four-byte primary for 10234..1042489=10234+16*254*254-1.
            uint32_t primary = numericPrimary | (2 + value % 254);
            value /= 254;
            primary |= (2 + value % 254) << 8;
            value /= 254;
            primary |= (firstByte + value % 254) << 16;
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        // original value > 1042489
    }
    U_ASSERT(length >= 7);

    // The second primary byte value 132..255 indicates the number of digit pairs (4..127),
    // then we generate primary bytes with those pairs.
    // Omit trailing 00 pairs.
    // Decrement the value for the last pair.

    // Set the exponent. 4 pairs->132, 5 pairs->133, ..., 127 pairs->255.
    int32_t numPairs = (length + 1) / 2;
    uint32_t primary = numericPrimary | ((132 - 4 + numPairs) << 16);
    // Find the length without trailing 00 pairs.
    while(digits[length - 1] == 0 && digits[length - 2] == 0) {
        length -= 2;
    }
    // Read the first pair.
    uint32_t pair;
    int32_t pos;
    if(length & 1) {
        // Only "half a pair" if we have an odd number of digits.
        pair = digits[0];
        pos = 1;
    } else {
        pair = digits[0] * 10 + digits[1];
        pos = 2;
    }
    pair = 11 + 2 * pair;
    // Add the pairs of digits between pos and length.
    int32_t shift = 8;
    while(pos < length) {
        if(shift == 0) {
            // Every three pairs/bytes we need to store a 4-byte-primary CE
            // and start with a new CE with the '0' primary lead byte.
            primary |= pair;
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            primary = numericPrimary;
            shift = 16;
        } else {
            primary |= pair << shift;
            shift -= 8;
        }
        pair = 11 + 2 * (digits[pos] * 10 + digits[pos + 1]);
        pos += 2;
    }
    primary |= (pair - 1) << shift;
    ceBuffer.append(Collation::makeCE(primary), errorCode);
}